

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_decomposition.hpp
# Opt level: O3

void __thiscall
polar::
polar_decomposition<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
          (polar *this,
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *A,matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *U,matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *H,double rtol,size_t max_iter)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  polar *ppVar7;
  matrix_size_type size1;
  pointer pdVar8;
  double *pdVar9;
  size_type sVar10;
  ulong uVar11;
  ulong uVar12;
  size_type sVar13;
  size_type sVar14;
  double *pdVar15;
  size_type sVar16;
  double *pdVar17;
  size_type i2;
  ulong uVar18;
  size_type i1;
  ulong uVar19;
  double *pdVar20;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  X;
  value_type gamma;
  undefined1 local_b8 [24];
  size_type local_a0;
  double *local_98;
  double local_90;
  polar *local_88;
  double local_80;
  double local_78;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_70;
  double local_68 [2];
  double *local_58;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_50;
  polar *local_48;
  polar *local_40;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_38;
  
  local_b8._0_8_ = *(undefined8 *)this;
  local_b8._8_8_ = *(undefined8 *)(this + 8);
  local_a0 = local_b8._8_8_ * local_b8._0_8_;
  local_88 = this;
  local_78 = rtol;
  local_70 = H;
  if (local_a0 == 0) {
    local_98 = (double *)0x0;
  }
  else {
    local_98 = __gnu_cxx::new_allocator<double>::allocate
                         ((new_allocator<double> *)(local_b8 + 0x10),local_a0,(void *)0x0);
  }
  uVar1 = A->size1_;
  uVar2 = A->size2_;
  uVar11 = local_b8._0_8_;
  if (uVar1 < (ulong)local_b8._0_8_) {
    uVar11 = uVar1;
  }
  uVar12 = local_b8._8_8_;
  if (uVar2 < (ulong)local_b8._8_8_) {
    uVar12 = uVar2;
  }
  if (uVar11 != 0) {
    pdVar8 = (A->data_).data_;
    uVar19 = 0;
    pdVar9 = local_98;
    do {
      if (uVar12 != 0) {
        uVar18 = 0;
        do {
          pdVar9[uVar18] = pdVar8[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar12 != uVar18);
      }
      uVar19 = uVar19 + 1;
      pdVar9 = pdVar9 + local_b8._8_8_;
      pdVar8 = pdVar8 + uVar2;
    } while (uVar19 != uVar11);
  }
  if ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
       *)local_b8 != A) {
    A->size1_ = local_b8._0_8_;
    A->size2_ = local_b8._8_8_;
    sVar3 = (A->data_).size_;
    (A->data_).size_ = local_a0;
    pdVar9 = (A->data_).data_;
    (A->data_).data_ = local_98;
    local_98 = pdVar9;
    local_b8._0_8_ = uVar1;
    local_b8._8_8_ = uVar2;
    local_a0 = sVar3;
  }
  if (local_a0 != 0) {
    operator_delete(local_98,local_a0 << 3);
  }
  ppVar7 = local_88;
  boost::numeric::ublas::
  indexing_matrix_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
            (A,local_88);
  local_b8._0_8_ = *(undefined8 *)ppVar7;
  local_b8._8_8_ = *(undefined8 *)(ppVar7 + 8);
  local_a0 = local_b8._8_8_ * local_b8._0_8_;
  if (local_a0 == 0) {
    local_98 = (double *)0x0;
  }
  else {
    local_98 = __gnu_cxx::new_allocator<double>::allocate
                         ((new_allocator<double> *)(local_b8 + 0x10),local_a0,(void *)0x0);
  }
  uVar1 = U->size1_;
  uVar2 = U->size2_;
  uVar11 = local_b8._0_8_;
  if (uVar1 < (ulong)local_b8._0_8_) {
    uVar11 = uVar1;
  }
  uVar12 = local_b8._8_8_;
  if (uVar2 < (ulong)local_b8._8_8_) {
    uVar12 = uVar2;
  }
  if (uVar11 != 0) {
    pdVar8 = (U->data_).data_;
    uVar19 = 0;
    pdVar9 = local_98;
    do {
      if (uVar12 != 0) {
        uVar18 = 0;
        do {
          pdVar9[uVar18] = pdVar8[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar12 != uVar18);
      }
      uVar19 = uVar19 + 1;
      pdVar9 = pdVar9 + local_b8._8_8_;
      pdVar8 = pdVar8 + uVar2;
    } while (uVar19 != uVar11);
  }
  if ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
       *)local_b8 != U) {
    U->size1_ = local_b8._0_8_;
    U->size2_ = local_b8._8_8_;
    sVar3 = (U->data_).size_;
    (U->data_).size_ = local_a0;
    pdVar9 = (U->data_).data_;
    (U->data_).data_ = local_98;
    local_98 = pdVar9;
    local_b8._0_8_ = uVar1;
    local_b8._8_8_ = uVar2;
    local_a0 = sVar3;
  }
  if (local_a0 != 0) {
    operator_delete(local_98,local_a0 << 3);
  }
  local_b8._0_8_ = *(undefined8 *)local_88;
  local_b8._8_8_ = *(undefined8 *)(local_88 + 8);
  local_a0 = local_b8._8_8_ * local_b8._0_8_;
  if (local_a0 == 0) {
    local_98 = (double *)0x0;
  }
  else {
    local_98 = __gnu_cxx::new_allocator<double>::allocate
                         ((new_allocator<double> *)(local_b8 + 0x10),local_a0,(void *)0x0);
  }
  pmVar21 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *)0x0;
  bVar4 = false;
  while( true ) {
    if (local_b8._0_8_ != 0) {
      sVar10 = A->size2_;
      pdVar8 = (A->data_).data_;
      sVar13 = 0;
      pdVar9 = local_98;
      do {
        if (local_b8._8_8_ != 0) {
          sVar16 = 0;
          do {
            pdVar9[sVar16] = pdVar8[sVar16];
            sVar16 = sVar16 + 1;
          } while (local_b8._8_8_ != sVar16);
        }
        sVar13 = sVar13 + 1;
        pdVar8 = pdVar8 + sVar10;
        pdVar9 = pdVar9 + local_b8._8_8_;
      } while (sVar13 != local_b8._0_8_);
    }
    detail::
    invert<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
              ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)local_b8,U);
    local_90 = 1.0;
    if (!bVar4) {
      dVar23 = 0.0;
      dVar22 = 0.0;
      if (local_b8._8_8_ != 0) {
        sVar10 = 0;
        pdVar9 = local_98;
        dVar24 = 0.0;
        do {
          dVar22 = 0.0;
          pdVar15 = pdVar9;
          for (sVar13 = local_b8._0_8_; sVar13 != 0; sVar13 = sVar13 - 1) {
            dVar22 = dVar22 + ABS(*pdVar15);
            pdVar15 = pdVar15 + local_b8._8_8_;
          }
          if (dVar22 <= dVar24) {
            dVar22 = dVar24;
          }
          sVar10 = sVar10 + 1;
          pdVar9 = pdVar9 + 1;
          dVar24 = dVar22;
        } while (sVar10 != local_b8._8_8_);
      }
      if (local_b8._0_8_ != 0) {
        sVar10 = 0;
        pdVar9 = local_98;
        dVar24 = 0.0;
        do {
          dVar23 = 0.0;
          if (local_b8._8_8_ != 0) {
            sVar13 = 0;
            do {
              dVar23 = dVar23 + ABS(pdVar9[sVar13]);
              sVar13 = sVar13 + 1;
            } while (local_b8._8_8_ != sVar13);
          }
          if (dVar23 <= dVar24) {
            dVar23 = dVar24;
          }
          sVar10 = sVar10 + 1;
          pdVar9 = pdVar9 + local_b8._8_8_;
          dVar24 = dVar23;
        } while (sVar10 != local_b8._0_8_);
      }
      dVar22 = dVar22 * dVar23;
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
      sVar10 = U->size1_;
      sVar13 = U->size2_;
      dVar24 = 0.0;
      dVar23 = 0.0;
      if (sVar13 != 0) {
        pdVar9 = (U->data_).data_;
        sVar16 = 0;
        dVar25 = 0.0;
        do {
          dVar23 = 0.0;
          pdVar15 = pdVar9;
          for (sVar14 = sVar10; sVar14 != 0; sVar14 = sVar14 - 1) {
            dVar23 = dVar23 + ABS(*pdVar15);
            pdVar15 = pdVar15 + sVar13;
          }
          if (dVar23 <= dVar25) {
            dVar23 = dVar25;
          }
          sVar16 = sVar16 + 1;
          pdVar9 = pdVar9 + 1;
          dVar25 = dVar23;
        } while (sVar16 != sVar13);
      }
      if (sVar10 != 0) {
        pdVar8 = (U->data_).data_;
        sVar16 = 0;
        dVar25 = 0.0;
        do {
          dVar24 = 0.0;
          if (sVar13 != 0) {
            sVar14 = 0;
            do {
              dVar24 = dVar24 + ABS(pdVar8[sVar14]);
              sVar14 = sVar14 + 1;
            } while (sVar13 != sVar14);
          }
          if (dVar24 <= dVar25) {
            dVar24 = dVar25;
          }
          sVar16 = sVar16 + 1;
          pdVar8 = pdVar8 + sVar13;
          dVar25 = dVar24;
        } while (sVar16 != sVar10);
      }
      dVar23 = dVar23 * dVar24;
      if (dVar23 < 0.0) {
        local_80 = dVar22;
        dVar23 = sqrt(dVar23);
        dVar22 = local_80;
      }
      else {
        dVar23 = SQRT(dVar23);
      }
      dVar23 = dVar23 / dVar22;
      if (dVar23 < 0.0) {
        local_90 = sqrt(dVar23);
      }
      else {
        local_90 = SQRT(dVar23);
      }
    }
    local_68[1] = 0.5;
    local_68[0] = 1.0 / local_90;
    local_58 = local_68 + 1;
    local_50 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)&local_90;
    local_40 = (polar *)local_68;
    local_48 = (polar *)local_b8;
    local_38 = U;
    boost::numeric::ublas::
    indexing_matrix_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_identity<double>>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::scalar_plus<double,double>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
              (A,&local_58);
    if (local_b8._8_8_ == 0) {
      dVar22 = 0.0;
      dVar23 = 0.0;
    }
    else {
      pdVar9 = (A->data_).data_;
      sVar10 = 0;
      pdVar15 = local_98;
      dVar23 = 0.0;
      do {
        dVar22 = 0.0;
        pdVar20 = pdVar9;
        pdVar17 = pdVar15;
        for (sVar13 = local_b8._0_8_; sVar13 != 0; sVar13 = sVar13 - 1) {
          dVar22 = dVar22 + ABS(*pdVar17 - *pdVar20);
          pdVar20 = pdVar20 + A->size2_;
          pdVar17 = pdVar17 + local_b8._8_8_;
        }
        if (dVar22 <= dVar23) {
          dVar22 = dVar23;
        }
        sVar10 = sVar10 + 1;
        pdVar9 = pdVar9 + 1;
        pdVar15 = pdVar15 + 1;
        dVar23 = dVar22;
      } while (sVar10 != local_b8._8_8_);
      sVar10 = 0;
      pdVar9 = local_98;
      dVar24 = 0.0;
      do {
        dVar23 = 0.0;
        pdVar15 = pdVar9;
        for (sVar13 = local_b8._0_8_; sVar13 != 0; sVar13 = sVar13 - 1) {
          dVar23 = dVar23 + ABS(*pdVar15);
          pdVar15 = pdVar15 + local_b8._8_8_;
        }
        if (dVar23 <= dVar24) {
          dVar23 = dVar24;
        }
        sVar10 = sVar10 + 1;
        pdVar9 = pdVar9 + 1;
        dVar24 = dVar23;
      } while (sVar10 != local_b8._8_8_);
    }
    if ((dVar22 < dVar23 * local_78) ||
       ((local_70 !=
         (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *)0x0 &&
        (pmVar21 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)((long)&pmVar21->size1_ + 1), pmVar21 == local_70)))) break;
    bVar6 = true;
    bVar5 = !bVar4;
    bVar4 = bVar6;
    if ((bVar5) && (local_b8._0_8_ != 0)) {
      pdVar8 = (A->data_).data_;
      dVar22 = 0.0;
      sVar10 = 0;
      pdVar9 = local_98;
      do {
        if (local_b8._8_8_ != 0) {
          sVar13 = 0;
          do {
            dVar22 = dVar22 + (pdVar9[sVar13] - pdVar8[sVar13]) * (pdVar9[sVar13] - pdVar8[sVar13]);
            sVar13 = sVar13 + 1;
          } while (local_b8._8_8_ != sVar13);
        }
        sVar10 = sVar10 + 1;
        pdVar8 = pdVar8 + A->size2_;
        pdVar9 = pdVar9 + local_b8._8_8_;
      } while (sVar10 != local_b8._0_8_);
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
      if (0.01 <= dVar22) {
        bVar4 = false;
      }
    }
  }
  local_90 = 0.5;
  local_58 = &local_90;
  local_48 = local_88;
  local_40 = local_88;
  local_50 = A;
  local_38 = A;
  boost::numeric::ublas::
  indexing_matrix_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix_matrix_binary<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_identity<double>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<d___umeric::ublas::scalar_plus<double,double>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
            (U);
  if (local_a0 != 0) {
    operator_delete(local_98,local_a0 << 3);
  }
  return;
}

Assistant:

void polar_decomposition(Matrix_in const& A, Matrix_out& U, Matrix_out& H,
        double rtol = 1.0e-8, std::size_t max_iter = 0)
{
    typedef typename Matrix_out::value_type value_type;

    BOOST_ASSERT(A.size1() == A.size2());

    U.resize(A.size1(), A.size2());
    U.assign(A);
    H.resize(A.size1(), A.size2());
    Matrix_out X(A.size1(), A.size2());

    std::size_t count = 0;
    bool close_to_convergence = false;

    while (true)
    {
        X.assign(U);
        detail::invert(X, H);
        value_type gamma = 1.0;

        if (!close_to_convergence)
        {
            value_type alpha = std::sqrt(norm_1(X) * norm_inf(X));
            value_type beta  = std::sqrt(norm_1(H) * norm_inf(H));
            gamma = std::sqrt(beta / alpha);
        }

        U.assign(0.5 * (gamma * X + 1.0 / gamma * trans(H)));

        if (norm_1(X - U) < rtol * norm_1(X))
            break;

        if (max_iter != 0 && ++count == max_iter)
            break;

        if (!close_to_convergence && norm_frobenius(X - U) < 1.0e-2)
            close_to_convergence = true;
    }

    H.assign(0.5 * (prod(trans(U), A) + prod(trans(A), U)));
}